

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int X509V3_NAME_from_section(X509_NAME *nm,stack_st_CONF_VALUE *dn_sk,ulong chtype)

{
  int iVar1;
  CONF_VALUE *pCVar2;
  int local_4c;
  char *pcStack_48;
  int mval;
  char *p;
  char *type;
  CONF_VALUE *v;
  size_t i;
  int chtype_local;
  stack_st_CONF_VALUE *dn_sk_local;
  X509_NAME *nm_local;
  
  if (nm == (X509_NAME *)0x0) {
    nm_local._4_4_ = 0;
  }
  else {
    for (v = (CONF_VALUE *)0x0;
        pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num((stack_st_CONF_VALUE *)dn_sk), v < pCVar2;
        v = (CONF_VALUE *)((long)&v->section + 1)) {
      pCVar2 = sk_CONF_VALUE_value((stack_st_CONF_VALUE *)dn_sk,(size_t)v);
      p = pCVar2->name;
      for (pcStack_48 = p; *pcStack_48 != '\0'; pcStack_48 = pcStack_48 + 1) {
        if (((*pcStack_48 == ':') || (*pcStack_48 == ',')) || (*pcStack_48 == '.')) {
          if (pcStack_48[1] != '\0') {
            p = pcStack_48 + 1;
          }
          break;
        }
      }
      if (*p == '+') {
        local_4c = -1;
        p = p + 1;
      }
      else {
        local_4c = 0;
      }
      iVar1 = X509_NAME_add_entry_by_txt(nm,p,(int)chtype,(uchar *)pCVar2->value,-1,-1,local_4c);
      if (iVar1 == 0) {
        return 0;
      }
    }
    nm_local._4_4_ = 1;
  }
  return nm_local._4_4_;
}

Assistant:

int X509V3_NAME_from_section(X509_NAME *nm, const STACK_OF(CONF_VALUE) *dn_sk,
                             int chtype) {
  if (!nm) {
    return 0;
  }

  for (size_t i = 0; i < sk_CONF_VALUE_num(dn_sk); i++) {
    const CONF_VALUE *v = sk_CONF_VALUE_value(dn_sk, i);
    const char *type = v->name;
    // Skip past any leading X. X: X, etc to allow for multiple instances
    for (const char *p = type; *p; p++) {
      if ((*p == ':') || (*p == ',') || (*p == '.')) {
        p++;
        if (*p) {
          type = p;
        }
        break;
      }
    }
    int mval;
    if (*type == '+') {
      mval = -1;
      type++;
    } else {
      mval = 0;
    }
    if (!X509_NAME_add_entry_by_txt(nm, type, chtype, (unsigned char *)v->value,
                                    -1, -1, mval)) {
      return 0;
    }
  }
  return 1;
}